

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall glcts::anon_unknown_0::UniformType::~UniformType(UniformType *this)

{
  std::__cxx11::string::~string((string *)&this->refStrType);
  std::__cxx11::string::~string((string *)&this->strType);
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector(&this->childTypes);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

UniformType(GLenum _enumType, int _arraySize = 0)
		: enumType(_enumType), arraySize(_arraySize), isArray(_arraySize > 0), signedType(true)
	{
		if (!arraySize)
		{
			arraySize = 1;
		}
		arraySizesSegmented.push_back(arraySize);
		fill();
	}